

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::replace_path_prefix
               (SmallVectorImpl<char> *Path,StringRef *OldPrefix,StringRef *NewPrefix,Style style)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  void *__s1;
  StringRef RelPath;
  SmallString<256U> NewPath;
  Twine local_1b0;
  Twine local_198;
  StringRef local_180;
  Twine local_170;
  Twine local_158;
  SmallVectorImpl<char> local_140;
  undefined1 local_130 [256];
  
  __n = OldPrefix->Length;
  if (__n == 0) {
    if (NewPrefix->Length == 0) {
      return;
    }
    __s1 = (Path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    if (NewPrefix->Length == 0) goto LAB_00179672;
    uVar2 = (ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  }
  else {
    uVar2 = (ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    if (uVar2 < __n) {
      return;
    }
    __s1 = (Path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    iVar1 = bcmp(__s1,OldPrefix->Data,__n);
    if (iVar1 != 0) {
      return;
    }
    if (__n == NewPrefix->Length) {
LAB_00179672:
      memmove(__s1,NewPrefix->Data,__n);
      return;
    }
  }
  local_180.Data = (char *)((long)__s1 + __n);
  local_180.Length = uVar2 - __n;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_130;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  Twine::Twine(&local_198,NewPrefix);
  Twine::Twine(&local_1b0,"");
  Twine::Twine(&local_158,"");
  Twine::Twine(&local_170,"");
  append(&local_140,style,&local_198,&local_1b0,&local_158,&local_170);
  Twine::Twine(&local_198,&local_180);
  Twine::Twine(&local_1b0,"");
  Twine::Twine(&local_158,"");
  Twine::Twine(&local_170,"");
  append(&local_140,style,&local_198,&local_1b0,&local_158,&local_170);
  SmallVectorImpl<char>::swap(Path,&local_140);
  if ((undefined1 *)
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_130) {
    free(local_140.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void replace_path_prefix(SmallVectorImpl<char> &Path,
                         const StringRef &OldPrefix, const StringRef &NewPrefix,
                         Style style) {
  if (OldPrefix.empty() && NewPrefix.empty())
    return;

  StringRef OrigPath(Path.begin(), Path.size());
  if (!OrigPath.startswith(OldPrefix))
    return;

  // If prefixes have the same size we can simply copy the new one over.
  if (OldPrefix.size() == NewPrefix.size()) {
    std::copy(NewPrefix.begin(), NewPrefix.end(), Path.begin());
    return;
  }

  StringRef RelPath = OrigPath.substr(OldPrefix.size());
  SmallString<256> NewPath;
  path::append(NewPath, style, NewPrefix);
  path::append(NewPath, style, RelPath);
  Path.swap(NewPath);
}